

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O0

void __thiscall Liby::TimerMixin::TimerMixin(TimerMixin *this)

{
  EventLoop *pEVar1;
  TimerMixin *this_local;
  
  this->_vptr_TimerMixin = (_func_int **)&PTR__TimerMixin_0018f3e0;
  std::
  unordered_map<unsigned_long,_Liby::TimerHolder,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Liby::TimerHolder>_>_>
  ::unordered_map(&this->timerHolders_);
  pEVar1 = EventLoop::curr_thread_loop();
  this->loop_ = pEVar1;
  return;
}

Assistant:

TimerMixin::TimerMixin() { loop_ = EventLoop::curr_thread_loop(); }